

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O3

void __thiscall
MeasurementToString_caseSensitive_Test::TestBody(MeasurementToString_caseSensitive_Test *this)

{
  unit uVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  int iVar4;
  unit *puVar5;
  uint64_t uVar6;
  precise_measurement *measure;
  unit match_flags;
  long lVar7;
  pointer ppVar8;
  long lVar9;
  char *in_R9;
  unit uVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  initializer_list<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string case_insensitive_plural_str;
  string plural;
  string singular_caps;
  precise_measurement case_insensitive_singular;
  precise_measurement case_insensitive_plural;
  string plural_caps;
  precise_measurement round_trip;
  precise_measurement case_insensitive_singular_caps;
  precise_measurement case_insensitive_plural_caps;
  precise_measurement case_sensitive_singular;
  string singular;
  precise_measurement case_sensitive_plural;
  string local_320;
  undefined1 local_300 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  unit local_2e0;
  long local_2d8;
  long local_2d0 [2];
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  AssertHelper local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  Message local_290;
  precise_measurement local_288;
  precise_measurement local_270;
  long *local_258;
  long local_250;
  long local_248 [2];
  precise_measurement local_238;
  precise_measurement local_220;
  precise_measurement local_208;
  precise_measurement local_1f0;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  pointer local_58;
  AssertHelper local_50;
  precise_measurement local_48;
  
  if ((TestBody()::twoc_units_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&TestBody()::twoc_units_abi_cxx11_), iVar4 != 0)) {
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_true>(&local_1d8,(unit *)&units::lb,(char (*) [3])0x1840a8);
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_true>(&local_1b0,(unit *)&units::oz,(char (*) [3])0x183b30);
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[3],_true>(&local_188,(unit *)&units::yd,(char (*) [3])0x18294e);
    local_2e0.multiplier_ = 0.00094635296;
    local_2e0.base_units_ = (unit_data)0x3;
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<units::unit,_const_char_(&)[3],_true>(&local_160,&local_2e0,(char (*) [3])0x1842ca);
    __l._M_len = 4;
    __l._M_array = &local_1d8;
    std::
    vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&TestBody()::twoc_units_abi_cxx11_,__l,(allocator_type *)&local_2c0);
    lVar9 = -0xa0;
    paVar12 = &local_160.second.field_2;
    do {
      if (paVar12 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar12->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar12->_M_allocated_capacity)[-2],
                        paVar12->_M_allocated_capacity + 1);
      }
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar12->_M_allocated_capacity + -5);
      lVar9 = lVar9 + 0x28;
    } while (lVar9 != 0);
    __cxa_atexit(std::
                 vector<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~vector,&TestBody()::twoc_units_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::twoc_units_abi_cxx11_);
  }
  local_58 = TestBody()::twoc_units_abi_cxx11_.
             super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppVar8 = TestBody()::twoc_units_abi_cxx11_.
           super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (TestBody()::twoc_units_abi_cxx11_.
      super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      TestBody()::twoc_units_abi_cxx11_.
      super__Vector_base<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_2e0 = (unit)local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"17 ","");
      puVar5 = (unit *)std::__cxx11::string::_M_append
                                 ((char *)&local_2e0,(ulong)(ppVar8->second)._M_dataplus._M_p);
      match_flags = (unit)(puVar5 + 2);
      if (*puVar5 == match_flags) {
        local_1d8.second._M_string_length = *(size_type *)match_flags;
        local_1d8.second.field_2._M_allocated_capacity = (size_type)puVar5[3];
        local_1d8.first = (unit)&local_1d8.second._M_string_length;
      }
      else {
        local_1d8.second._M_string_length = *(size_type *)match_flags;
        local_1d8.first = *puVar5;
      }
      local_1d8.second._M_dataplus._M_p = *(pointer *)(puVar5 + 1);
      *puVar5 = match_flags;
      puVar5[1].multiplier_ = 0.0;
      puVar5[1].base_units_ = (unit_data)0x0;
      *(undefined1 *)&puVar5[2].multiplier_ = 0;
      if (local_2e0 != (unit)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      local_2e0 = (unit)local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      std::__cxx11::string::push_back((char)&local_2e0);
      local_2c0 = local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      _Var3._M_p = local_1d8.second._M_dataplus._M_p;
      uVar1 = local_1d8.first;
      plVar2 = local_2c0;
      if ((unit)local_1d8.second._M_dataplus._M_p != (unit)0x0) {
        uVar10.multiplier_ = 0.0;
        uVar10.base_units_ = (unit_data)0x0;
        do {
          iVar4 = toupper((int)*(char *)((long)uVar1 + (long)uVar10));
          *(char *)((long)plVar2 + (long)uVar10) = (char)iVar4;
          uVar10 = (unit)((long)uVar10 + 1);
        } while ((unit)_Var3._M_p != uVar10);
      }
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_2e0,local_2d8 + (long)local_2e0);
      plVar2 = local_258;
      lVar9 = local_2d8;
      uVar1 = local_2e0;
      if (local_2d8 == 0) {
        lVar7 = 0;
      }
      else {
        lVar11 = 0;
        do {
          iVar4 = toupper((int)*(char *)((long)uVar1 + lVar11));
          *(char *)((long)plVar2 + lVar11) = (char)iVar4;
          lVar11 = lVar11 + 1;
          lVar7 = local_2d8;
        } while (lVar9 != lVar11);
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_2e0,lVar7 + (long)local_2e0);
      paVar12 = &local_320.field_2;
      uVar6 = units::getDefaultFlags();
      units::measurement_from_string(&local_48,&local_118,uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(ppVar8->first).base_units_ ^ (uint)local_48.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_1f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_1f0.value_ + 0x10),"error with ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_1f0.value_ + 0x10),(ppVar8->second)._M_dataplus._M_p,
                   (ppVar8->second)._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_320,(internal *)local_300,
                   (AssertionResult *)"case_sensitive_plural.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.28412e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_270,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xa3,local_320._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_1f0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar12) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_1f0.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_1f0.value_ + 8))();
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      uVar6 = units::getDefaultFlags();
      units::measurement_from_string(&local_1f0,&local_138,uVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(ppVar8->first).base_units_ ^ (uint)local_1f0.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_270);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_320,(internal *)local_300,
                   (AssertionResult *)"case_sensitive_singular.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.34017e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_288,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xa7,local_320._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)&local_270)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar12) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_270.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_270.value_ + 8))();
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,local_2e0,local_2d8 + (long)local_2e0);
      units::measurement_from_string(&local_270,&local_78,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(ppVar8->first).base_units_ ^ (uint)local_270.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_288);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_288.value_ + 0x10),(ppVar8->second)._M_dataplus._M_p,
                   (ppVar8->second)._M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_320,(internal *)local_300,
                   (AssertionResult *)"case_insensitive_plural.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.42425e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xad,local_320._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)&local_288)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar12) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_288.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_288.value_ + 8))();
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_1d8.first,
                 (long)local_1d8.second._M_dataplus._M_p + (long)local_1d8.first);
      units::measurement_from_string(&local_288,&local_98,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(ppVar8->first).base_units_ ^ (uint)local_288.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_320,(internal *)local_300,
                   (AssertionResult *)"case_insensitive_singular.units().has_same_base(up.first)",
                   "false","true",in_R9);
        match_flags.multiplier_ = 2.50832e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_220,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xb3,local_320._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_220,(Message *)&local_208)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar12) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_208.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_208.value_ + 8))();
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_258,local_250 + (long)local_258);
      units::measurement_from_string(&local_208,&local_b8,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(ppVar8->first).base_units_ ^ (uint)local_208.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_220);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_320,(internal *)local_300,
                   (AssertionResult *)"case_insensitive_plural_caps.units().has_same_base(up.first)"
                   ,"false","true",in_R9);
        match_flags.multiplier_ = 2.60642e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xba,local_320._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_220)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar12) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_220.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_220.value_ + 8))();
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
      }
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_2c0,local_2b8 + (long)local_2c0);
      units::measurement_from_string(&local_220,&local_d8,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      local_300[0] = (internal)
                     ((((uint)(ppVar8->first).base_units_ ^ (uint)local_220.units_.base_units_) &
                      0xfffffff) == 0);
      local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_300[0]) {
        testing::Message::Message((Message *)&local_238);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_320,(internal *)local_300,
                   (AssertionResult *)
                   "case_insensitive_singular_caps.units().has_same_base(up.first)","false","true",
                   in_R9);
        match_flags.multiplier_ = 2.69049e-43;
        match_flags.base_units_ = (unit_data)0x0;
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,0xc0,local_320._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != paVar12) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_238.value_ != (long *)0x0) {
          (**(code **)(*(long *)local_238.value_ + 8))();
        }
        if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2f8,local_2f8);
        }
      }
      measure = (precise_measurement *)units::getDefaultFlags();
      units::to_string_abi_cxx11_(&local_320,(units *)&local_270,measure,(uint64_t)match_flags);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_320._M_dataplus._M_p,
                 local_320._M_dataplus._M_p + local_320._M_string_length);
      units::measurement_from_string(&local_238,&local_f8,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      local_2a0.data_._0_1_ =
           (internal)
           ((((uint)(ppVar8->first).base_units_ ^ (uint)local_238.units_.base_units_) & 0xfffffff)
           == 0);
      local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_2a0.data_._0_1_) {
        testing::Message::Message(&local_290);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_300,(internal *)&local_2a0,
                   (AssertionResult *)"round_trip.units().has_same_base(up.first)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
                   ,199,(char *)CONCAT71(local_300._1_7_,local_300[0]));
        testing::internal::AssertHelper::operator=(&local_50,&local_290);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_300._1_7_,local_300[0]) != &local_2f0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_300._1_7_,local_300[0]),
                          local_2f0._M_allocated_capacity + 1);
        }
        if (local_290.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)local_290.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (local_298 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_298,local_298);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar12) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      if (local_2c0 != local_2b0) {
        operator_delete(local_2c0,local_2b0[0] + 1);
      }
      if (local_2e0 != (unit)local_2d0) {
        operator_delete((void *)local_2e0,local_2d0[0] + 1);
      }
      if (local_1d8.first != (unit)&local_1d8.second._M_string_length) {
        operator_delete((void *)local_1d8.first,local_1d8.second._M_string_length + 1);
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != local_58);
  }
  return;
}

Assistant:

TEST(MeasurementToString, caseSensitive)
{
    static const std::vector<std::pair<unit, std::string>> twoc_units{
        {lb, "lb"},
        {oz, "oz"},
        {yd, "yd"},
        {unit_cast(precise::us::quart), "qt"}};

    for (const auto& up : twoc_units) {
        std::string singular = std::string("17 ") + up.second;
        std::string plural = singular;
        plural.push_back('s');

        std::string singular_caps = singular;
        std::transform(
            singular.begin(), singular.end(), singular_caps.begin(), ::toupper);

        std::string plural_caps = plural;
        std::transform(
            plural.begin(), plural.end(), plural_caps.begin(), ::toupper);

        precise_measurement case_sensitive_plural =
            measurement_from_string(plural);
        // true
        EXPECT_TRUE(case_sensitive_plural.units().has_same_base(up.first))
            << "error with " << up.second;
        precise_measurement case_sensitive_singular =
            measurement_from_string(singular);
        EXPECT_TRUE(case_sensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion
        precise_measurement case_insensitive_plural =
            measurement_from_string(plural, case_insensitive);
        // true
        EXPECT_TRUE(case_insensitive_plural.units().has_same_base(up.first))
            << up.second;

        units::precise_measurement case_insensitive_singular =
            measurement_from_string(singular, case_insensitive);
        // false
        EXPECT_TRUE(case_insensitive_singular.units().has_same_base(up.first));

        // Case insensitive string conversion caps
        precise_measurement case_insensitive_plural_caps =
            measurement_from_string(plural_caps, case_insensitive);
        // true
        EXPECT_TRUE(
            case_insensitive_plural_caps.units().has_same_base(up.first));

        units::precise_measurement case_insensitive_singular_caps =
            measurement_from_string(singular_caps, case_insensitive);
        // false
        EXPECT_TRUE(
            case_insensitive_singular_caps.units().has_same_base(up.first));

        // Round trip
        const std::string case_insensitive_plural_str =
            units::to_string(case_insensitive_plural);
        units::precise_measurement round_trip = units::measurement_from_string(
            case_insensitive_plural_str, units::case_insensitive);
        EXPECT_TRUE(round_trip.units().has_same_base(up.first));
    }
}